

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  ArrayIndex AVar1;
  runtime_error *this_00;
  key_type local_58;
  Value local_48;
  
  if (this->field_0x8 == '\0') {
    Value(&local_48,arrayValue);
    swap(this,&local_48);
    ~Value(&local_48);
  }
  else if (this->field_0x8 != '\x06') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"in Json::Value::resize(): requires arrayValue");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  AVar1 = size(this);
  if (newSize == 0) {
    clear(this);
    return;
  }
  if (newSize <= AVar1) {
    for (; AVar1 != newSize; newSize = newSize + 1) {
      local_58.cstr_ = (char *)0x0;
      local_58.index_ = newSize;
      std::
      _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::erase(&((this->value_).map_)->_M_t,&local_58);
      CZString::~CZString(&local_58);
    }
    return;
  }
  operator[](this,newSize - 1);
  return;
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    (*this)[newSize - 1];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    assert(size() == newSize);
  }
#else
  value_.array_->resize(newSize);
#endif
}